

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O3

void __thiscall ON_UserData::ON_UserData(ON_UserData *this)

{
  long lVar1;
  ON_Xform *pOVar2;
  ON_Xform *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081bdf8;
  (this->m_userdata_uuid).Data1 = 0;
  (this->m_userdata_uuid).Data2 = 0;
  (this->m_userdata_uuid).Data3 = 0;
  (this->m_userdata_uuid).Data4[0] = '\0';
  (this->m_userdata_uuid).Data4[1] = '\0';
  (this->m_userdata_uuid).Data4[2] = '\0';
  (this->m_userdata_uuid).Data4[3] = '\0';
  (this->m_userdata_uuid).Data4[4] = '\0';
  (this->m_userdata_uuid).Data4[5] = '\0';
  (this->m_userdata_uuid).Data4[6] = '\0';
  (this->m_userdata_uuid).Data4[7] = '\0';
  (this->m_application_uuid).Data1 = 0;
  (this->m_application_uuid).Data2 = 0;
  (this->m_application_uuid).Data3 = 0;
  (this->m_application_uuid).Data4[0] = '\0';
  (this->m_application_uuid).Data4[1] = '\0';
  (this->m_application_uuid).Data4[2] = '\0';
  (this->m_application_uuid).Data4[3] = '\0';
  (this->m_application_uuid).Data4[4] = '\0';
  (this->m_application_uuid).Data4[5] = '\0';
  (this->m_application_uuid).Data4[6] = '\0';
  (this->m_application_uuid).Data4[7] = '\0';
  this->m_userdata_copycount = 0;
  pOVar2 = &ON_Xform::IdentityTransformation;
  pOVar3 = &this->m_userdata_xform;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar3->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  this->m_userdata_owner = (ON_Object *)0x0;
  this->m_userdata_next = (ON_UserData *)0x0;
  return;
}

Assistant:

ON_UserData::ON_UserData()
            : m_userdata_uuid(ON_nil_uuid), 
              m_application_uuid(ON_nil_uuid),
              m_userdata_copycount(0),
              m_userdata_xform(ON_Xform::IdentityTransformation),
              m_userdata_owner(0),
              m_userdata_next(0)
{}